

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O1

int __thiscall coda_url::assign_refers(coda_url *this,char *beg,uint32_t flags)

{
  char *__src;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *__dest;
  
  __src = coda_strnchr(this->val_str,'?',(ulong)this->val_len);
  pcVar3 = this->val_str + this->val_len;
  if (__src == (char *)0x0) {
    __src = pcVar3;
  }
  pcVar2 = beg;
  pcVar4 = beg;
  pcVar5 = beg;
  __dest = __src;
  if (beg < __src) {
    do {
      pcVar4 = pcVar2;
      if (*pcVar5 == '/') {
        if ((__dest + -4 < pcVar5) ||
           (pcVar1 = coda_strnstr(pcVar5,"/../",4), pcVar1 == (char *)0x0)) {
          pcVar1 = pcVar5;
          if ((__dest + -3 < pcVar5) ||
             (pcVar2 = coda_strnstr(pcVar5,"/./",3), pcVar2 == (char *)0x0)) {
            if ((__dest + -2 < pcVar5) ||
               (pcVar2 = coda_strnstr(pcVar5,"//",2), pcVar2 == (char *)0x0)) {
              pcVar1 = pcVar5 + 1;
              pcVar4 = pcVar5;
            }
            else {
              memmove(pcVar5,pcVar5 + 1,(long)__dest - (long)(pcVar5 + 1));
              __dest = __dest + -1;
            }
          }
          else {
            memmove(pcVar5,pcVar5 + 2,(long)__dest - (long)(pcVar5 + 2));
            __dest = __dest + -2;
          }
        }
        else {
          pcVar5 = pcVar5 + 3;
          memmove(pcVar2,pcVar5,(long)__dest - (long)pcVar5);
          __dest = __dest + ((long)pcVar2 - (long)pcVar5);
          pcVar5 = pcVar2;
          do {
            pcVar5 = pcVar5 + -1;
            pcVar1 = pcVar2;
            pcVar4 = pcVar2;
            if (pcVar5 < beg) break;
            pcVar4 = pcVar5;
          } while (*pcVar5 != '/');
        }
      }
      else {
        pcVar1 = pcVar5 + 1;
      }
      pcVar2 = pcVar4;
      pcVar5 = pcVar1;
    } while (pcVar1 < __dest);
  }
  if ((pcVar4 == __dest + -3) && (pcVar2 = coda_strnstr(pcVar4,"/..",3), pcVar2 != (char *)0x0)) {
    pcVar2 = pcVar4;
    if (beg < pcVar4) {
      do {
        pcVar5 = pcVar2;
        pcVar2 = pcVar5 + -1;
        if (pcVar2 < beg) goto LAB_00104fc1;
      } while (*pcVar2 != '/');
      if (pcVar2 <= beg) {
        pcVar2 = pcVar5;
      }
      if ((flags & 1) != 0) {
        pcVar2 = pcVar5;
      }
      __dest = __dest + (long)(pcVar2 + (-3 - (long)pcVar4));
    }
    else {
      __dest = __dest + -2;
    }
  }
  else {
    pcVar2 = __dest + -2;
    if ((pcVar4 == pcVar2) && (pcVar5 = coda_strnstr(pcVar4,"/.",2), pcVar5 != (char *)0x0)) {
      __dest = __dest + -1;
      if (pcVar4 <= beg) {
        pcVar2 = __dest;
      }
    }
    else {
      if (pcVar4 != __dest + -1) goto LAB_00104fc1;
      pcVar5 = coda_strnstr(pcVar4,"/",1);
      pcVar2 = __dest + -1;
      if (pcVar4 <= beg) {
        pcVar2 = __dest;
      }
      if (pcVar5 == (char *)0x0) {
        pcVar2 = __dest;
      }
    }
    if ((flags & 1) == 0) {
      __dest = pcVar2;
    }
  }
LAB_00104fc1:
  if (pcVar3 != __src) {
    memmove(__dest,__src,(long)pcVar3 - (long)__src);
    __dest = __dest + ((long)pcVar3 - (long)__src);
  }
  uVar6 = (int)__dest - (int)this->val_str;
  this->val_len = uVar6;
  memcpy(this->val_str + (ulong)uVar6 + 1,this->dom_str,(ulong)this->dom_len);
  this->dom_str = this->val_str + this->val_len + 1;
  this->val_str[this->val_len] = '\0';
  this->dom_str[this->dom_len] = '\0';
  return 0;
}

Assistant:

int coda_url::assign_refers(char *beg, uint32_t flags)
{
	char *eofp = coda_strnchr(val_str, '?', val_len);
	if (NULL == eofp) eofp = val_str + val_len;

	char *args = eofp;
	size_t args_len = val_str + val_len - args;

	char *p = beg;
	char *prev = p;

	while (p < eofp)
	{
		if (*p == '/')
		{
			if (p <= eofp - 4 && coda_strnstr(p, "/../", 4) != 0) // /foo/../bar -> /bar
			{
				memmove(prev, p + 3, eofp - (p + 3));
				eofp -= p + 3 - prev;

				p = prev;

				for (char *pp = p - 1; pp >= beg; --pp)
				{
					if (*pp == '/')
					{
						prev = pp;
						break;
					}
				}
			}
			else if (p <= eofp - 3 && coda_strnstr(p, "/./", 3) != 0) // /foo/./bar -> /foo/bar
			{
				memmove(p, p + 2, eofp - (p + 2));
				eofp -= 2;
			}
#if 1
			/*
			 * mozilla & opera thinks that // is directory with empty name
			 * but in unix-paths // == /./ let's think as mozilla, but just comment 
			 * this code for potential future usage.
			 */
			else if (p <= eofp - 2 && coda_strnstr(p, "//", 2) != 0) // /foo//bar -> /foo/bar
			{
				memmove(p, p + 1, eofp - (p + 1));
				eofp -= 1;
			}
#endif
			else
			{
				prev = p;
				++p;
			}
		}
		else
		{
			++p;
		}
	}